

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_filename(Twine *path,Style style)

{
  StringRef SVar1;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_a0;
  undefined1 local_90 [128];
  
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_90;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  SVar1 = Twine::toStringRef(path,&local_a0);
  SVar1 = filename(SVar1,style);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_a0);
  return SVar1.Length != 0;
}

Assistant:

bool has_filename(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !filename(p, style).empty();
}